

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

void __thiscall
flatbuffers::dart::DartGenerator::TableBuilderBody
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *code)

{
  FieldDef *d;
  Namespace *current_namespace;
  bool bVar1;
  size_type_conflict t;
  pointer ppVar2;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string field_var;
  string local_f8;
  undefined1 local_d8 [8];
  string add_field;
  int offset;
  FieldDef *field;
  __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
  local_a0;
  const_iterator it;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *code_local;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *non_deprecated_fields_local;
  StructDef *struct_def_local;
  DartGenerator *this_local;
  
  local_28 = code;
  code_local = (string *)non_deprecated_fields;
  non_deprecated_fields_local =
       (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
        *)struct_def;
  struct_def_local = (StructDef *)this;
  std::__cxx11::string::operator+=((string *)code,"  void begin() {\n");
  t = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                 &non_deprecated_fields_local[10].
                  super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  NumToString<unsigned_long>(&local_88,t);
  std::operator+(&local_68,"    fbBuilder.startTable(",&local_88);
  std::operator+(&local_48,&local_68,");\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::operator+=((string *)local_28,"  }\n\n");
  local_a0._M_current =
       (pair<int,_flatbuffers::FieldDef_*> *)
       std::
       vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
       ::begin((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                *)code_local);
  while( true ) {
    field = (FieldDef *)
            std::
            vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
            ::end((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                   *)code_local);
    bVar1 = __gnu_cxx::operator!=
                      (&local_a0,
                       (__normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
                        *)&field);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
             ::operator->(&local_a0);
    d = ppVar2->second;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
             ::operator->(&local_a0);
    add_field.field_2._12_4_ = ppVar2->first;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"add",(allocator<char> *)(field_var.field_2._M_local_buf + 0xf));
    IdlNamer::Method((string *)local_d8,&this->namer_,&local_f8,d);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)(field_var.field_2._M_local_buf + 0xf));
    IdlNamer::Variable_abi_cxx11_((string *)local_120,&this->namer_,d);
    bVar1 = IsScalar((d->value).type.base_type);
    if (bVar1) {
      std::operator+(&local_160,"  int ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      std::operator+(&local_140,&local_160,"(");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      current_namespace =
           (Namespace *)
           non_deprecated_fields_local[7].
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1a1);
      GenDartTypeName(&local_180,this,&(d->value).type,current_namespace,d,&local_1a0);
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      std::operator+(&local_1e8,"? ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120)
      ;
      std::operator+(&local_1c8,&local_1e8,") {\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      GenType_abi_cxx11_(&local_288,this,&(d->value).type);
      std::operator+(&local_268,"    fbBuilder.add",&local_288);
      std::operator+(&local_248,&local_268,"(");
      NumToString<int>(&local_2a8,add_field.field_2._12_4_);
      std::operator+(&local_228,&local_248,&local_2a8);
      std::operator+(&local_208,&local_228,", ");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::operator+=((string *)local_28,(string *)local_120);
      if ((d->value).type.enum_def != (EnumDef *)0x0) {
        std::__cxx11::string::operator+=((string *)local_28,"?.value");
      }
      std::__cxx11::string::operator+=((string *)local_28,");\n");
    }
    else {
      bVar1 = IsStruct(&(d->value).type);
      if (bVar1) {
        std::operator+(&local_2e8,"  int ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
        std::operator+(&local_2c8,&local_2e8,"(int offset) {\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
        NumToString<int>(&local_348,add_field.field_2._12_4_);
        std::operator+(&local_328,"    fbBuilder.addStruct(",&local_348);
        std::operator+(&local_308,&local_328,", offset);\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_348);
      }
      else {
        std::operator+(&local_388,"  int ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
        std::operator+(&local_368,&local_388,"Offset(int? offset) {\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_388);
        NumToString<int>(&local_3e8,add_field.field_2._12_4_);
        std::operator+(&local_3c8,"    fbBuilder.addOffset(",&local_3e8);
        std::operator+(&local_3a8,&local_3c8,", offset);\n");
        std::__cxx11::string::operator+=((string *)local_28,(string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::__cxx11::string::~string((string *)&local_3e8);
      }
    }
    std::__cxx11::string::operator+=((string *)local_28,"    return fbBuilder.offset;\n");
    std::__cxx11::string::operator+=((string *)local_28,"  }\n");
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_d8);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>_>
    ::operator++(&local_a0);
  }
  std::__cxx11::string::operator+=((string *)local_28,"\n");
  std::__cxx11::string::operator+=((string *)local_28,"  int finish() {\n");
  std::__cxx11::string::operator+=((string *)local_28,"    return fbBuilder.endTable();\n");
  std::__cxx11::string::operator+=((string *)local_28,"  }\n");
  return;
}

Assistant:

void TableBuilderBody(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      std::string &code) {
    code += "  void begin() {\n";
    code += "    fbBuilder.startTable(" +
            NumToString(struct_def.fields.vec.size()) + ");\n";
    code += "  }\n\n";

    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const auto &field = *it->second;
      const auto offset = it->first;
      const std::string add_field = namer_.Method("add", field);
      const std::string field_var = namer_.Variable(field);

      if (IsScalar(field.value.type.base_type)) {
        code += "  int " + add_field + "(";
        code += GenDartTypeName(field.value.type, struct_def.defined_namespace,
                                field);
        code += "? " + field_var + ") {\n";
        code += "    fbBuilder.add" + GenType(field.value.type) + "(" +
                NumToString(offset) + ", ";
        code += field_var;
        if (field.value.type.enum_def) { code += "?.value"; }
        code += ");\n";
      } else if (IsStruct(field.value.type)) {
        code += "  int " + add_field + "(int offset) {\n";
        code +=
            "    fbBuilder.addStruct(" + NumToString(offset) + ", offset);\n";
      } else {
        code += "  int " + add_field + "Offset(int? offset) {\n";
        code +=
            "    fbBuilder.addOffset(" + NumToString(offset) + ", offset);\n";
      }
      code += "    return fbBuilder.offset;\n";
      code += "  }\n";
    }

    code += "\n";
    code += "  int finish() {\n";
    code += "    return fbBuilder.endTable();\n";
    code += "  }\n";
  }